

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
::ReadSymbolicExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                   *this)

{
  StringRef value;
  char cVar1;
  int iVar2;
  int iVar3;
  undefined8 *in_RDI;
  Expr else_expr;
  Expr then_expr;
  LogicalExpr condition;
  int opcode;
  char c;
  int in_stack_0000006c;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
  *in_stack_00000070;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 uVar4;
  undefined4 uVar5;
  Kind kind;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
  *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffe0 [16];
  undefined2 uVar6;
  undefined7 in_stack_fffffffffffffff0;
  
  uVar6 = in_stack_ffffffffffffffe0._14_2_;
  uVar5 = SUB84(in_RDI,0);
  kind = (Kind)((ulong)in_RDI >> 0x20);
  cVar1 = ReaderBase::ReadChar((ReaderBase *)*in_RDI);
  if (cVar1 == 'h') {
    uVar4 = *(undefined8 *)(CONCAT44(kind,uVar5) + 0x10);
    BinaryReader<mp::internal::EndiannessConverter>::ReadString
              ((BinaryReader<mp::internal::EndiannessConverter> *)CONCAT44(kind,uVar5));
    value.size_._0_4_ = uVar5;
    value.data_ = (char *)uVar4;
    value.size_._4_4_ = kind;
    NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>::OnString
              ((NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),value);
  }
  else if (cVar1 == 'o') {
    iVar2 = ReadOpCode((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                        *)CONCAT44(kind,uVar5));
    iVar3 = mp::expr::nl_opcode(kind);
    if (iVar2 == iVar3) {
      ReadLogicalExpr(in_stack_ffffffffffffffd0);
      ReadSymbolicExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                        *)CONCAT17(cVar1,in_stack_fffffffffffffff0));
      ReadSymbolicExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                        *)CONCAT17(cVar1,in_stack_fffffffffffffff0));
      NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>::OnSymbolicIf
                (*(NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>
                   **)(CONCAT44(kind,uVar5) + 0x10));
    }
    else {
      ReadNumericExpr(in_stack_00000070,in_stack_0000006c);
    }
  }
  else {
    ReadNumericExpr((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                     *)CONCAT17(cVar1,in_stack_fffffffffffffff0),(char)((ushort)uVar6 >> 8),
                    SUB21(uVar6,0));
  }
  return;
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}